

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

void __thiscall libDAI::JTree::runShaferShenoy(JTree *this)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  pointer pTVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer pDVar6;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  ulong *puVar13;
  double dVar14;
  Factor piet;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  this->_logZ = 0.0;
  lVar7 = (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    do {
      lVar7 = lVar7 + -1;
      pDVar6 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar11 = pDVar6[lVar7].n1;
      sVar1 = pDVar6[lVar7].n2;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_a0,
                 (TFactor<double> *)(sVar1 * 0x40 + *(long *)(CONCAT44(extraout_var,iVar5) + 0xe0)))
      ;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      plVar9 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x140) + sVar1 * 0x18);
      while( true ) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (plVar9 == *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x140) + 8 +
                                sVar1 * 0x18)) break;
        lVar10 = *plVar9;
        if (lVar10 != lVar7) {
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator*=
                    (&local_a0,
                     (this->_mes).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar5) + 0x128) +
                                        sVar1 * 0x18) + lVar10 * 8));
        }
        plVar9 = plVar9 + 1;
      }
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::partSum
                (&local_68,&local_a0,
                 (VarSet *)(lVar7 * 0x28 + *(long *)(CONCAT44(extraout_var_03,iVar5) + 0xf8)));
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::operator=
                ((this->_mes).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_04,iVar5) + 0x128) +
                                    sVar11 * 0x18) + lVar7 * 8),&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      dVar14 = TProb<double>::normalize
                         (&(this->_mes).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [*(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_05,iVar5) + 0x128) +
                                               sVar11 * 0x18) + lVar7 * 8)]._p,NORMPROB);
      dVar14 = log(dVar14);
      this->_logZ = dVar14 + this->_logZ;
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    } while (lVar7 != 0);
  }
  pDVar6 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pDVar6) {
    uVar8 = 0;
    do {
      sVar11 = pDVar6[uVar8].n1;
      sVar1 = pDVar6[uVar8].n2;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_a0,
                 (TFactor<double> *)
                 (sVar11 * 0x40 + *(long *)(CONCAT44(extraout_var_06,iVar5) + 0xe0)));
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      puVar13 = *(ulong **)(*(long *)(CONCAT44(extraout_var_07,iVar5) + 0x140) + sVar11 * 0x18);
      while( true ) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (puVar13 ==
            *(ulong **)(*(long *)(CONCAT44(extraout_var_08,iVar5) + 0x140) + 8 + sVar11 * 0x18))
        break;
        uVar2 = *puVar13;
        if (uVar2 != uVar8) {
          iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator*=
                    (&local_a0,
                     (this->_mes).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_09,iVar5) + 0x128) +
                                        sVar11 * 0x18) + uVar2 * 8));
        }
        puVar13 = puVar13 + 1;
      }
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::marginal
                (&local_68,&local_a0,
                 (VarSet *)(uVar8 * 0x28 + *(long *)(CONCAT44(extraout_var_10,iVar5) + 0xf8)),true);
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::operator=
                ((this->_mes).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar5) + 0x128) +
                                    sVar1 * 0x18) + uVar8 * 8),&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar8 = uVar8 + 1;
      pDVar6 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->_RTree).
                                   super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4));
  }
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_12,iVar5) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var_12,iVar5) + 0xe0)) {
    sVar11 = 0;
    do {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_a0,
                 (TFactor<double> *)
                 (sVar11 * 0x40 + *(long *)(CONCAT44(extraout_var_13,iVar5) + 0xe0)));
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      plVar9 = *(long **)(*(long *)(CONCAT44(extraout_var_14,iVar5) + 0x140) + sVar11 * 0x18);
      while( true ) {
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (plVar9 == *(long **)(*(long *)(CONCAT44(extraout_var_15,iVar5) + 0x140) + 8 +
                                sVar11 * 0x18)) break;
        lVar7 = *plVar9;
        iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::operator*=
                  (&local_a0,
                   (this->_mes).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_16,iVar5) + 0x128) +
                                      sVar11 * 0x18) + lVar7 * 8));
        plVar9 = plVar9 + 1;
      }
      pDVar6 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pDVar6 == (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        dVar14 = TProb<double>::normalize(&local_a0._p,NORMPROB);
LAB_004bb91f:
        dVar14 = log(dVar14);
        this->_logZ = dVar14 + this->_logZ;
        TFactor<double>::operator=
                  ((this->_Qa).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar11,&local_a0);
      }
      else {
        if (sVar11 == pDVar6->n1) {
          dVar14 = TProb<double>::normalize(&local_a0._p,NORMPROB);
          goto LAB_004bb91f;
        }
        TFactor<double>::normalized(&local_68,&local_a0,NORMPROB);
        TFactor<double>::operator=
                  ((this->_Qa).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar11,&local_68);
        if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      sVar11 = sVar11 + 1;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    } while (sVar11 < (ulong)(*(long *)(CONCAT44(extraout_var_17,iVar5) + 0xe8) -
                              *(long *)(CONCAT44(extraout_var_17,iVar5) + 0xe0) >> 6));
  }
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_18,iVar5) + 0x100) !=
      *(long *)(CONCAT44(extraout_var_18,iVar5) + 0xf8)) {
    lVar10 = 0;
    lVar7 = 0;
    lVar12 = 0;
    uVar8 = 0;
    do {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar3 = **(long **)(*(long *)(CONCAT44(extraout_var_19,iVar5) + 0x158) + lVar12);
      pTVar4 = (this->_Qa).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::marginal
                (&local_a0,pTVar4 + lVar3,
                 (VarSet *)(*(long *)(CONCAT44(extraout_var_20,iVar5) + 0xf8) + lVar7),true);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&(((this->_Qb).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar10),&local_a0);
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar8 = uVar8 + 1;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar12 = lVar12 + 0x18;
      lVar7 = lVar7 + 0x28;
      lVar10 = lVar10 + 0x38;
    } while (uVar8 < (ulong)((*(long *)(CONCAT44(extraout_var_21,iVar5) + 0x100) -
                              *(long *)(CONCAT44(extraout_var_21,iVar5) + 0xf8) >> 3) *
                            -0x3333333333333333));
  }
  return;
}

Assistant:

void JTree::runShaferShenoy() {
        // First pass
        _logZ = 0.0;
        for( size_t e = _RTree.size(); (e--) != 0; ) {
            // send a message from _RTree[e].n2 to _RTree[e].n1
            // or, actually, from the seperator IR(e) to _RTree[e].n1

            size_t i = _RTree[e].n2;
            size_t j = _RTree[e].n1;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.partSum( grm().IR(e) );
            _logZ += log( message(j,e).normalize() );
        }

        // Second pass
        for( size_t e = 0; e < _RTree.size(); e++ ) {
            size_t i = _RTree[e].n1;
            size_t j = _RTree[e].n2;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.marginal( grm().IR(e) );
        }

        // Calculate beliefs
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            Factor piet = grm().OR(alpha);
            for( RegionGraph::R_nb_cit k = grm().nbOR(alpha).begin(); k != grm().nbOR(alpha).end(); k++ )
                piet *= message( alpha, *k );
            if( _RTree.empty() ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else if( alpha == _RTree[0].n1 ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else
                _Qa[alpha] = piet.normalized();
        }

        // Only for logZ (and for belief)...
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb[beta] = _Qa[grm().nbIR(beta)[0]].marginal( grm().IR(beta) );
    }